

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O3

void aom_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,int num_planes)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar3 = ybf->border;
  bVar1 = (byte)ybf->subsampling_x;
  bVar2 = (byte)ybf->subsampling_y;
  if ((ybf->flags & 8) == 0) {
    if (0 < num_planes) {
      uVar11 = 0;
      do {
        bVar12 = uVar11 != 0;
        uVar8 = (ulong)bVar12;
        bVar7 = 0;
        if (bVar12) {
          bVar7 = bVar2;
        }
        bVar6 = 0;
        if (bVar12) {
          bVar6 = bVar1;
        }
        iVar9 = iVar3 >> (bVar7 & 0x1f);
        iVar10 = iVar3 >> (bVar6 & 0x1f);
        iVar4 = *(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x30);
        iVar5 = *(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x38);
        extend_plane(ybf->store_buf_adr[uVar11 - 4],
                     *(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x28),iVar5,iVar4,iVar9,iVar10
                     ,(*(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x40) - iVar4) + iVar9,
                     (*(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x48) + iVar10) - iVar5,0,
                     iVar4);
        uVar11 = uVar11 + 1;
      } while ((uint)num_planes != uVar11);
    }
  }
  else if (0 < num_planes) {
    uVar11 = 0;
    do {
      bVar12 = uVar11 != 0;
      uVar8 = (ulong)bVar12;
      bVar7 = 0;
      if (bVar12) {
        bVar7 = bVar2;
      }
      bVar6 = 0;
      if (bVar12) {
        bVar6 = bVar1;
      }
      iVar9 = iVar3 >> (bVar7 & 0x1f);
      iVar10 = iVar3 >> (bVar6 & 0x1f);
      iVar4 = *(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x30);
      iVar5 = *(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x38);
      extend_plane_high(ybf->store_buf_adr[uVar11 - 4],
                        *(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x28),iVar5,iVar4,iVar9,
                        iVar10,(*(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x40) - iVar4) +
                               iVar9,
                        (*(int *)((long)ybf->store_buf_adr + uVar8 * 4 + -0x48) + iVar10) - iVar5,0,
                        iVar4);
      uVar11 = uVar11 + 1;
    } while ((uint)num_planes != uVar11);
  }
  return;
}

Assistant:

void aom_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf, const int num_planes) {
  extend_frame(ybf, ybf->border, num_planes);
}